

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

void PID_Regular_Cacl(PID_Regular_t *PID_Regular)

{
  PID_Regular_t *PID_Regular_local;
  
  PID_Regular_Cacl::Error = PID_Regular->Ref - PID_Regular->Feedback;
  PID_Regular_Cacl::Delta = PID_Regular_Cacl::Error - PID_Regular->Error;
  PID_Regular->PrevError = PID_Regular->LastError;
  PID_Regular->LastError = PID_Regular->Error;
  PID_Regular->Error = PID_Regular_Cacl::Error;
  PID_Regular_Cacl::Integrate = PID_Regular_Cacl::Error + PID_Regular->IntError;
  absLimit(&PID_Regular_Cacl::Integrate,PID_Regular->MaxInt);
  PID_Regular->IntError = PID_Regular_Cacl::Integrate;
  PID_Regular_Cacl::Output =
       -PID_Regular->Kd * PID_Regular_Cacl::Delta +
       PID_Regular->Kp * PID_Regular_Cacl::Error + PID_Regular->Ki * PID_Regular_Cacl::Integrate;
  absLimit(&PID_Regular_Cacl::Output,PID_Regular->MaxOutput);
  PID_Regular->Output = PID_Regular_Cacl::Output;
  return;
}

Assistant:

void PID_Regular_Cacl(PID_Regular_t *PID_Regular)
{
	static float Error = 0.0f, Integrate = 0.0f, Delta = 0.0f, Output = 0.0f;
	Error = PID_Regular->Ref - PID_Regular->Feedback;
	Delta = Error - PID_Regular->Error;
	PID_Regular->PrevError = PID_Regular->LastError;
	PID_Regular->LastError = PID_Regular->Error;
	PID_Regular->Error = Error;
	Integrate = Error + PID_Regular->IntError;
	absLimit(&Integrate, PID_Regular->MaxInt);
	PID_Regular->IntError = Integrate;
	Output = PID_Regular->Kp * Error + PID_Regular->Ki * Integrate - PID_Regular->Kd * Delta;
	absLimit(&Output, PID_Regular->MaxOutput);
	PID_Regular->Output = Output;
}